

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx2.cpp
# Opt level: O1

int __thiscall
ncnn::Convolution_x86_avx2::forward_int8_x86
          (Convolution_x86_avx2 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  _func_int **pp_Var6;
  _func_int *p_Var7;
  size_t sVar8;
  Layer *pLVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined4 uVar16;
  undefined1 uVar17;
  undefined1 uVar19;
  undefined1 uVar21;
  undefined1 uVar23;
  Mat *pMVar24;
  Option *pOVar25;
  int iVar26;
  _func_int *p_Var27;
  ulong uVar28;
  long lVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  ulong uVar37;
  ulong uVar38;
  int outw;
  int iVar39;
  uint uVar40;
  uint uVar41;
  int iVar42;
  long lVar43;
  undefined8 *puVar44;
  long lVar45;
  ulong uVar46;
  uint uVar47;
  int iVar48;
  void *pvVar50;
  size_t sVar51;
  long lVar52;
  undefined8 *puVar53;
  void *pvVar54;
  int iVar55;
  int iVar56;
  void *pvVar57;
  bool bVar58;
  float fVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [64];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [64];
  undefined1 auVar66 [16];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [16];
  void *local_230;
  void *local_228;
  int w;
  ulong local_218;
  float local_20c;
  void *local_208;
  void *local_200;
  long local_1f8;
  int local_1ec;
  Mat *local_1e8;
  void *local_1e0;
  Option *local_1d8;
  Mat *local_1d0;
  Option opt_q;
  float scale_out;
  Mat top_blob_int32;
  Mat bottom_blob_bordered;
  vector<float,_std::allocator<float>_> local_a8;
  vector<float,_std::allocator<float>_> local_90;
  undefined1 local_78 [56];
  int local_40;
  size_t local_38;
  undefined4 uVar18;
  undefined3 uVar20;
  undefined2 uVar22;
  ulong uVar49;
  
  local_78._24_4_ = bottom_blob->elempack;
  if (local_78._24_4_ == 0) {
    bVar58 = false;
  }
  else {
    bVar58 = ((int)bottom_blob->elemsize << 3) / (int)local_78._24_4_ == 8;
  }
  piVar5 = bottom_blob->refcount;
  local_78._0_8_ = bottom_blob->data;
  local_78._8_4_ = SUB84(bottom_blob->refcount,0);
  local_78._12_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
  local_78._16_8_ = bottom_blob->elemsize;
  local_78._32_8_ = bottom_blob->allocator;
  local_78._40_4_ = bottom_blob->dims;
  local_78._44_4_ = bottom_blob->w;
  local_78._48_4_ = bottom_blob->h;
  local_78._52_4_ = bottom_blob->d;
  local_40 = bottom_blob->c;
  local_38 = bottom_blob->cstep;
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + 1;
    UNLOCK();
  }
  if (!bVar58) {
    opt_q.lightmode = opt->lightmode;
    opt_q._1_3_ = *(undefined3 *)&opt->field_0x1;
    opt_q.num_threads = opt->num_threads;
    opt_q.workspace_allocator = opt->workspace_allocator;
    uVar16 = opt->openmp_blocktime;
    uVar17 = opt->use_winograd_convolution;
    uVar19 = opt->use_sgemm_convolution;
    uVar21 = opt->use_int8_inference;
    uVar23 = opt->use_vulkan_compute;
    uVar22 = CONCAT11(uVar23,uVar21);
    uVar20 = CONCAT21(uVar22,uVar19);
    uVar18 = CONCAT31(uVar20,uVar17);
    opt_q.use_bf16_storage = opt->use_bf16_storage;
    opt_q.use_fp16_packed = opt->use_fp16_packed;
    opt_q.use_fp16_storage = opt->use_fp16_storage;
    opt_q.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_q.use_int8_packed = opt->use_int8_packed;
    opt_q.use_int8_storage = opt->use_int8_storage;
    opt_q.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_q.use_packing_layout = opt->use_packing_layout;
    opt_q.use_shader_pack8 = opt->use_shader_pack8;
    opt_q.use_subgroup_basic = opt->use_subgroup_basic;
    opt_q.use_subgroup_vote = opt->use_subgroup_vote;
    opt_q.use_subgroup_ballot = opt->use_subgroup_ballot;
    opt_q.use_subgroup_shuffle = opt->use_subgroup_shuffle;
    opt_q.use_image_storage = opt->use_image_storage;
    opt_q.use_tensor_storage = opt->use_tensor_storage;
    opt_q.use_weight_fp16_storage = opt->use_weight_fp16_storage;
    opt_q.flush_denormals = opt->flush_denormals;
    opt_q.use_local_pool_allocator = opt->use_local_pool_allocator;
    opt_q.use_reserved_1 = opt->use_reserved_1;
    opt_q.use_reserved_2 = opt->use_reserved_2;
    opt_q.use_reserved_3 = opt->use_reserved_3;
    opt_q.use_reserved_4 = opt->use_reserved_4;
    opt_q.use_reserved_5 = opt->use_reserved_5;
    opt_q.use_reserved_6 = opt->use_reserved_6;
    opt_q.use_reserved_7 = opt->use_reserved_7;
    opt_q.use_reserved_8 = opt->use_reserved_8;
    opt_q.use_reserved_9 = opt->use_reserved_9;
    opt_q.use_reserved_10 = opt->use_reserved_10;
    opt_q.use_reserved_11 = opt->use_reserved_11;
    opt_q.blob_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
    opt_q.blob_allocator._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    opt_q.openmp_blocktime = uVar16;
    opt_q._28_4_ = uVar18;
    quantize_to_int8(bottom_blob,(Mat *)local_78,
                     (Mat *)(&this->field_0x238 + (long)this->_vptr_Convolution_x86_avx2[-3]),&opt_q
                    );
  }
  bottom_blob_bordered.cstep = 0;
  bottom_blob_bordered.data = (void *)0x0;
  bottom_blob_bordered.refcount._0_4_ = 0;
  bottom_blob_bordered.refcount._4_4_ = 0;
  bottom_blob_bordered.elemsize = 0;
  bottom_blob_bordered.elempack = 0;
  bottom_blob_bordered.allocator = (Allocator *)0x0;
  bottom_blob_bordered.dims = 0;
  bottom_blob_bordered.w = 0;
  bottom_blob_bordered.h = 0;
  bottom_blob_bordered.d = 0;
  bottom_blob_bordered.c = 0;
  Convolution::make_padding
            ((Convolution *)
             ((long)&this->_vptr_Convolution_x86_avx2 + (long)this->_vptr_Convolution_x86_avx2[-3]),
             (Mat *)local_78,&bottom_blob_bordered,opt);
  iVar3 = bottom_blob_bordered.c;
  iVar48 = bottom_blob_bordered.elempack;
  iVar39 = -100;
  opt_q.blob_allocator =
       (Allocator *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
  if ((bottom_blob_bordered.data == (void *)0x0) ||
     (opt_q.blob_allocator =
           (Allocator *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_),
     (long)bottom_blob_bordered.c * bottom_blob_bordered.cstep == 0)) goto LAB_00186942;
  p_Var27 = this->_vptr_Convolution_x86_avx2[-3];
  iVar55 = (~((*(int *)(p_Var27 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data) + -1) *
             *(int *)(p_Var27 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data)) +
           bottom_blob_bordered.w) /
           *(int *)(p_Var27 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data) + 1;
  iVar56 = (~((*(int *)(p_Var27 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data) + -1) *
             *(int *)(p_Var27 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data)) +
           bottom_blob_bordered.h) / *(int *)((long)&this->convolution_dilation1 + (long)p_Var27) +
           1;
  sVar51 = 1;
  if (opt->use_packing_layout == true) {
    sVar51 = (size_t)((uint)(((byte)(p_Var27 + 0x30)[(long)&(this->weight_data_3x3_winograd63).data]
                             & 3) == 0) * 3 + 1);
  }
  local_1ec = *(int *)(p_Var27 + 0x18 + (long)&(this->weight_data_int8).data);
  iVar4 = (int)sVar51;
  uVar28 = (ulong)(uint)(iVar4 * 4);
  if (100 < local_1ec) {
    uVar28 = sVar51;
  }
  Mat::create(top_blob,iVar55,iVar56,
              *(int *)(p_Var27 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data) / iVar4,
              uVar28,iVar4,opt->blob_allocator);
  opt_q.blob_allocator =
       (Allocator *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
  if ((top_blob->data == (void *)0x0) ||
     (opt_q.blob_allocator =
           (Allocator *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_),
     (long)top_blob->c * top_blob->cstep == 0)) goto LAB_00186942;
  top_blob_int32.cstep = 0;
  top_blob_int32.data = (void *)0x0;
  top_blob_int32.refcount._0_4_ = 0;
  top_blob_int32.refcount._4_4_ = 0;
  top_blob_int32.elemsize = 0;
  top_blob_int32.elempack = 0;
  top_blob_int32.allocator = (Allocator *)0x0;
  top_blob_int32.dims = 0;
  top_blob_int32.w = 0;
  top_blob_int32.h = 0;
  top_blob_int32.d = 0;
  top_blob_int32.c = 0;
  local_1e8 = top_blob;
  local_1d8 = opt;
  Mat::create(&top_blob_int32,iVar55,iVar56,
              *(int *)(this->_vptr_Convolution_x86_avx2[-3] + 0x30 +
                      (long)&(this->weight_data_3x3_winograd63).data) / iVar4,
              (ulong)(uint)(iVar4 * 4),iVar4,opt->workspace_allocator);
  iVar26 = bottom_blob_bordered.c;
  iVar30 = bottom_blob_bordered.w;
  iVar56 = top_blob_int32.h;
  iVar55 = top_blob_int32.w;
  iVar39 = -100;
  opt_q.blob_allocator =
       (Allocator *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
  if ((top_blob_int32.data != (void *)0x0) &&
     (opt_q.blob_allocator =
           (Allocator *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_),
     (long)top_blob_int32.c * top_blob_int32.cstep != 0)) {
    if ((iVar48 == 8) && (iVar4 == 4)) {
      p_Var27 = this->_vptr_Convolution_x86_avx2[-3];
      uVar40 = *(uint *)(p_Var27 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data);
      if ((ulong)uVar40 == 1) {
        if ((((*(int *)(p_Var27 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data) == 1) &&
             (*(int *)(p_Var27 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data) == 1)) &&
            (*(int *)(p_Var27 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data) == 1)) &&
           ((*(int *)(p_Var27 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data) == 1 &&
            (*(int *)((long)&this->convolution_dilation1 + (long)p_Var27) == 1)))) {
          conv1x1s1_sgemm_pack8to4_int8_sse
                    (&bottom_blob_bordered,&top_blob_int32,&this->weight_data_int8,local_1d8);
        }
        else {
          if ((((uVar40 != 1) ||
               ((*(int *)(p_Var27 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data) != 1 ||
                (*(int *)(p_Var27 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data) != 1))))
              || (*(int *)(p_Var27 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data) != 1))
             || ((*(int *)(p_Var27 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data) != 2 ||
                 (*(int *)((long)&this->convolution_dilation1 + (long)p_Var27) != 2))))
          goto LAB_001851fc;
          conv1x1s2_pack8to4_int8_sse
                    (&bottom_blob_bordered,&top_blob_int32,&this->weight_data_int8,local_1d8);
        }
      }
      else {
LAB_001851fc:
        uVar2 = *(uint *)(p_Var27 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data);
        iVar39 = *(int *)(p_Var27 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data);
        local_1f8 = (long)*(int *)(p_Var27 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data);
        iVar33 = *(int *)(p_Var27 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data);
        local_208 = (void *)(long)*(int *)((long)&this->convolution_dilation1 + (long)p_Var27);
        uVar38 = (ulong)(uint)bottom_blob_bordered.c;
        uVar28 = (ulong)(uint)top_blob_int32.w;
        pvVar50 = (void *)(ulong)(uint)top_blob_int32.h;
        if (local_1d8->use_sgemm_convolution == true) {
          opt_q.lightmode = false;
          opt_q._1_3_ = 0;
          opt_q.num_threads = 0;
          opt_q.blob_allocator._0_4_ = 0;
          opt_q.blob_allocator._4_4_ = 0;
          opt_q.workspace_allocator = (Allocator *)0x0;
          opt_q.openmp_blocktime = 0;
          opt_q._32_28_ = ZEXT1228((undefined1  [12])0x0);
          Mat::create((Mat *)&opt_q,top_blob_int32.h * top_blob_int32.w,uVar40 * uVar2,
                      bottom_blob_bordered.c,8,8,local_1d8->workspace_allocator);
          local_1d0 = &this->weight_data_int8;
          if (0 < iVar26) {
            iVar30 = iVar30 * (int)local_208;
            local_1e0 = bottom_blob_bordered.data;
            local_208 = (void *)opt_q._0_8_;
            local_200 = (void *)(bottom_blob_bordered.w * local_1f8);
            local_228 = (void *)0x0;
            do {
              if (0 < (int)uVar2) {
                local_1f8 = bottom_blob_bordered.elemsize * (long)local_200;
                uVar46 = 0;
                puVar53 = (undefined8 *)opt_q._0_8_;
                do {
                  if (0 < (int)uVar40) {
                    uVar37 = 0;
                    do {
                      if (0 < iVar56) {
                        puVar44 = (undefined8 *)
                                  ((long)bottom_blob_bordered.data +
                                  uVar37 * (long)iVar39 * 8 +
                                  local_1f8 * uVar46 +
                                  bottom_blob_bordered.cstep * (long)local_228 *
                                  bottom_blob_bordered.elemsize);
                        iVar26 = 0;
                        do {
                          uVar49 = uVar28;
                          if (0 < iVar55) {
                            do {
                              *puVar53 = *puVar44;
                              puVar53 = puVar53 + 1;
                              puVar44 = puVar44 + iVar33;
                              uVar47 = (int)uVar49 - 1;
                              uVar49 = (ulong)uVar47;
                            } while (uVar47 != 0);
                          }
                          puVar44 = puVar44 + (iVar30 - iVar55 * iVar33);
                          iVar26 = iVar26 + 1;
                        } while (iVar26 != iVar56);
                      }
                      uVar37 = uVar37 + 1;
                    } while (uVar37 != uVar40);
                  }
                  uVar46 = uVar46 + 1;
                } while (uVar46 != uVar2);
              }
              local_228 = (void *)((long)local_228 + 1);
            } while (local_228 != (void *)uVar38);
          }
          im2col_sgemm_pack8to4_int8_sse((Mat *)&opt_q,&top_blob_int32,local_1d0,local_1d8);
          piVar5 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              if (opt_q._32_8_ == 0) {
                if (opt_q._0_8_ != 0) {
                  free((void *)opt_q._0_8_);
                }
              }
              else {
                (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
              }
            }
          }
        }
        else {
          local_1d0 = (Mat *)(ulong)(uint)top_blob_int32.c;
          uVar47 = uVar40 * uVar2;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&opt_q,(long)(int)uVar47,
                     (allocator_type *)&local_20c);
          if (0 < (int)uVar2) {
            iVar36 = 0;
            iVar31 = 0;
            uVar41 = 0;
            do {
              if (0 < (int)uVar40) {
                lVar43 = 0;
                do {
                  *(int *)(opt_q._0_8_ + (long)iVar36 * 4 + lVar43 * 4) = iVar31;
                  iVar31 = iVar31 + iVar39;
                  lVar43 = lVar43 + 1;
                } while (uVar40 != (uint)lVar43);
                iVar36 = iVar36 + (uint)lVar43;
              }
              iVar31 = iVar31 + (iVar30 * (int)local_1f8 - iVar39 * uVar40);
              uVar41 = uVar41 + 1;
            } while (uVar41 != uVar2);
          }
          if (0 < (int)local_1d0) {
            local_1e0 = (void *)((long)iVar55 * 4);
            local_228 = (void *)0x0;
            do {
              if (0 < iVar56) {
                _w = (void *)(top_blob_int32.cstep * (long)local_228 * top_blob_int32.elemsize +
                             (long)top_blob_int32.data);
                local_200 = (void *)0x0;
                do {
                  if (0 < iVar55) {
                    local_1f8 = (long)local_200 * (long)local_208;
                    uVar46 = 0;
                    do {
                      if (iVar26 < 1) {
                        auVar69 = (undefined1  [16])0x0;
                        auVar63 = (undefined1  [16])0x0;
                        auVar66 = (undefined1  [16])0x0;
                        auVar60 = (undefined1  [16])0x0;
                      }
                      else {
                        pvVar57 = (void *)((this->weight_data_int8).cstep * (long)local_228 *
                                           (this->weight_data_int8).elemsize +
                                          (long)(this->weight_data_int8).data);
                        auVar62 = ZEXT1664((undefined1  [16])0x0);
                        uVar37 = 0;
                        auVar68 = ZEXT1664((undefined1  [16])0x0);
                        auVar67 = ZEXT1664((undefined1  [16])0x0);
                        auVar65 = ZEXT1664((undefined1  [16])0x0);
                        do {
                          if (0 < (int)uVar47) {
                            lVar43 = 0;
                            do {
                              auVar69._8_8_ = 0;
                              auVar69._0_8_ =
                                   *(ulong *)((long)bottom_blob_bordered.data +
                                             (long)*(int *)(opt_q._0_8_ + lVar43) * 8 +
                                             bottom_blob_bordered.elemsize *
                                             bottom_blob_bordered.cstep * uVar37 +
                                             (long)(iVar33 * 8 * (int)uVar46) +
                                             local_1f8 * bottom_blob_bordered.elemsize *
                                             (long)bottom_blob_bordered.w);
                              auVar60 = vpcmpgtb_avx((undefined1  [16])0x0,auVar69);
                              auVar15 = vpunpcklbw_avx(auVar69,auVar60);
                              auVar60 = *(undefined1 (*) [16])((long)pvVar57 + lVar43 * 8);
                              auVar69 = *(undefined1 (*) [16])((long)pvVar57 + lVar43 * 8 + 0x10);
                              auVar63 = vpcmpgtb_avx((undefined1  [16])0x0,auVar60);
                              auVar66 = vpcmpgtb_avx((undefined1  [16])0x0,auVar69);
                              auVar61 = vpunpcklbw_avx(auVar60,auVar63);
                              auVar60 = vpunpckhbw_avx(auVar60,auVar63);
                              auVar63 = vpunpcklbw_avx(auVar69,auVar66);
                              auVar69 = vpunpckhbw_avx(auVar69,auVar66);
                              auVar11 = vpmullw_avx(auVar61,auVar15);
                              auVar61 = vpmulhw_avx(auVar61,auVar15);
                              auVar12 = vpmullw_avx(auVar15,auVar60);
                              auVar64 = vpmulhw_avx(auVar15,auVar60);
                              auVar13 = vpmullw_avx(auVar63,auVar15);
                              auVar10 = vpmulhw_avx(auVar63,auVar15);
                              auVar14 = vpmullw_avx(auVar15,auVar69);
                              auVar15 = vpmulhw_avx(auVar15,auVar69);
                              auVar60 = vpunpcklwd_avx(auVar11,auVar61);
                              auVar60 = vpaddd_avx(auVar62._0_16_,auVar60);
                              auVar69 = vpunpcklwd_avx(auVar12,auVar64);
                              auVar69 = vpaddd_avx(auVar68._0_16_,auVar69);
                              auVar63 = vpunpcklwd_avx(auVar13,auVar10);
                              auVar63 = vpaddd_avx(auVar67._0_16_,auVar63);
                              auVar66 = vpunpcklwd_avx(auVar14,auVar15);
                              auVar66 = vpaddd_avx(auVar65._0_16_,auVar66);
                              auVar61 = vpunpckhwd_avx(auVar11,auVar61);
                              auVar60 = vpaddd_avx(auVar60,auVar61);
                              auVar62 = ZEXT1664(auVar60);
                              auVar60 = vpunpckhwd_avx(auVar12,auVar64);
                              auVar60 = vpaddd_avx(auVar69,auVar60);
                              auVar68 = ZEXT1664(auVar60);
                              auVar60 = vpunpckhwd_avx(auVar13,auVar10);
                              auVar60 = vpaddd_avx(auVar63,auVar60);
                              auVar67 = ZEXT1664(auVar60);
                              auVar60 = vpunpckhwd_avx(auVar14,auVar15);
                              auVar60 = vpaddd_avx(auVar66,auVar60);
                              auVar65 = ZEXT1664(auVar60);
                              lVar43 = lVar43 + 4;
                            } while ((ulong)uVar47 << 2 != lVar43);
                            pvVar57 = (void *)((long)pvVar57 + (ulong)uVar47 * 0x20);
                          }
                          auVar63 = auVar67._0_16_;
                          auVar69 = auVar65._0_16_;
                          auVar66 = auVar68._0_16_;
                          auVar60 = auVar62._0_16_;
                          uVar37 = uVar37 + 1;
                        } while (uVar37 != uVar38);
                      }
                      auVar61 = vpunpckldq_avx(auVar60,auVar66);
                      auVar64 = vpunpckldq_avx(auVar63,auVar69);
                      auVar66 = vpunpckhdq_avx(auVar60,auVar66);
                      auVar69 = vpunpckhdq_avx(auVar63,auVar69);
                      auVar63 = vpunpcklqdq_avx(auVar61,auVar64);
                      auVar60 = vpunpckhqdq_avx(auVar61,auVar64);
                      auVar60 = vpaddd_avx(auVar63,auVar60);
                      auVar63 = vpunpcklqdq_avx(auVar66,auVar69);
                      auVar69 = vpunpckhqdq_avx(auVar66,auVar69);
                      auVar69 = vpaddd_avx(auVar69,auVar63);
                      auVar60 = vpaddd_avx(auVar60,auVar69);
                      *(undefined1 (*) [16])((long)_w + uVar46 * 0x10) = auVar60;
                      uVar46 = uVar46 + 1;
                    } while (uVar46 != uVar28);
                  }
                  _w = (void *)((long)_w + (long)iVar55 * 0x10);
                  local_200 = (void *)((long)local_200 + 1);
                } while (local_200 != pvVar50);
              }
              local_228 = (void *)((long)local_228 + 1);
            } while ((Mat *)local_228 != local_1d0);
          }
          if (opt_q._0_8_ != 0) {
            operator_delete((void *)opt_q._0_8_,(long)opt_q.workspace_allocator - opt_q._0_8_);
          }
        }
      }
      opt_q.lightmode = false;
      opt_q._1_3_ = 0;
      opt_q.num_threads = 0;
      opt_q.blob_allocator._0_4_ = 0;
      opt_q.blob_allocator._4_4_ = 0;
      opt_q.workspace_allocator = (Allocator *)0x0;
      opt_q.openmp_blocktime = 0;
      opt_q._32_12_ = SUB1612((undefined1  [16])0x0,0);
      opt_q._32_28_ = ZEXT1228((undefined1  [12])opt_q._32_12_);
      Mat::create((Mat *)&opt_q,
                  *(int *)(this->_vptr_Convolution_x86_avx2[-3] + 0x30 +
                          (long)&(this->weight_data_3x3_winograd63).data),4,(Allocator *)0x0);
      pOVar25 = local_1d8;
      pMVar24 = local_1e8;
      pp_Var6 = this->_vptr_Convolution_x86_avx2;
      p_Var7 = pp_Var6[-3];
      p_Var27 = (_func_int *)((long)&this->_vptr_Convolution_x86_avx2 + (long)p_Var7);
      if (0 < *(int *)(p_Var7 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data)) {
        lVar43 = 0;
        do {
          fVar1 = *(float *)(*(long *)(p_Var27 + 0x1f0) + lVar43 * 4);
          fVar59 = 0.0;
          if (fVar1 != 0.0) {
            fVar59 = 1.0 / (fVar1 * **(float **)(p_Var27 + 0x238));
          }
          *(float *)(opt_q._0_8_ + lVar43 * 4) = fVar59;
          lVar43 = lVar43 + 1;
          p_Var7 = pp_Var6[-3];
          p_Var27 = (_func_int *)((long)&this->_vptr_Convolution_x86_avx2 + (long)p_Var7);
        } while (lVar43 < *(int *)(p_Var7 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data));
      }
      if (local_1ec < 0x65) {
        dequantize_from_int32
                  (&top_blob_int32,local_1e8,(Mat *)&opt_q,(Mat *)(p_Var27 + 0x1a8),local_1d8);
        pLVar9 = this->activation;
        if (pLVar9 != (Layer *)0x0) {
          (*pLVar9->_vptr_Layer[9])(pLVar9,pMVar24,pOVar25);
        }
      }
      else {
        requantize_from_int32_to_int8
                  (&top_blob_int32,local_1e8,(Mat *)&opt_q,(Mat *)(p_Var27 + 0x280),
                   (Mat *)(p_Var27 + 0x1a8),*(int *)(p_Var27 + 0x10c),(Mat *)(p_Var27 + 0x110),
                   local_1d8);
      }
      piVar5 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (opt_q._32_8_ == 0) {
            if (opt_q._0_8_ != 0) {
              free((void *)opt_q._0_8_);
            }
          }
          else {
            (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
          }
        }
      }
    }
    iVar56 = bottom_blob_bordered.c;
    iVar55 = bottom_blob_bordered.w;
    iVar39 = top_blob_int32.w;
    if ((iVar48 == 1) && (iVar4 == 4)) {
      p_Var27 = this->_vptr_Convolution_x86_avx2[-3];
      iVar30 = *(int *)(p_Var27 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data);
      iVar26 = *(int *)(p_Var27 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data);
      iVar33 = *(int *)(p_Var27 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data);
      iVar36 = *(int *)(p_Var27 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data);
      local_1f8 = (long)*(int *)(p_Var27 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data);
      local_208 = (void *)(long)*(int *)((long)&this->convolution_dilation1 + (long)p_Var27);
      uVar28 = (ulong)(uint)bottom_blob_bordered.c;
      lVar43 = (long)top_blob_int32.w;
      local_200 = (void *)(ulong)(uint)top_blob_int32.h;
      local_1d0 = (Mat *)(ulong)(uint)top_blob_int32.c;
      uVar40 = iVar30 * iVar26;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&opt_q,(long)(int)uVar40,
                 (allocator_type *)&local_20c);
      if (0 < iVar26) {
        iVar31 = 0;
        iVar34 = 0;
        iVar42 = 0;
        do {
          if (0 < iVar30) {
            lVar45 = 0;
            do {
              *(int *)(opt_q._0_8_ + (long)iVar31 * 4 + lVar45 * 4) = iVar34;
              iVar34 = iVar34 + iVar33;
              lVar45 = lVar45 + 1;
            } while (iVar30 != (int)lVar45);
            iVar31 = iVar31 + (int)lVar45;
          }
          iVar34 = iVar34 + (iVar55 * iVar36 - iVar33 * iVar30);
          iVar42 = iVar42 + 1;
        } while (iVar42 != iVar26);
      }
      if (0 < (int)local_1d0) {
        local_1e0 = (void *)(lVar43 * 4);
        _w = (void *)0x0;
        do {
          if (0 < (int)local_200) {
            pvVar50 = (void *)(top_blob_int32.cstep * (long)_w * top_blob_int32.elemsize +
                              (long)top_blob_int32.data);
            local_228 = (void *)0x0;
            do {
              if (0 < iVar39) {
                lVar45 = 0;
                do {
                  if (iVar56 < 1) {
                    auVar60 = (undefined1  [16])0x0;
                  }
                  else {
                    pvVar57 = (void *)((this->weight_data_int8).cstep * (long)_w *
                                       (this->weight_data_int8).elemsize +
                                      (long)(this->weight_data_int8).data);
                    auVar62 = ZEXT1664((undefined1  [16])0x0);
                    uVar38 = 0;
                    do {
                      if (0 < (int)uVar40) {
                        uVar46 = 0;
                        do {
                          auVar63._0_2_ =
                               (short)*(char *)((long)bottom_blob_bordered.data +
                                               (long)*(int *)(opt_q._0_8_ + uVar46 * 4) +
                                               bottom_blob_bordered.cstep *
                                               bottom_blob_bordered.elemsize * uVar38 +
                                               lVar45 * local_1f8 +
                                               (long)bottom_blob_bordered.w *
                                               (long)local_228 * (long)local_208 *
                                               bottom_blob_bordered.elemsize);
                          auVar63._2_2_ = auVar63._0_2_;
                          auVar63._4_2_ = auVar63._0_2_;
                          auVar63._6_2_ = auVar63._0_2_;
                          auVar63._8_2_ = auVar63._0_2_;
                          auVar63._10_2_ = auVar63._0_2_;
                          auVar63._12_2_ = auVar63._0_2_;
                          auVar63._14_2_ = auVar63._0_2_;
                          auVar66._8_8_ = 0;
                          auVar66._0_8_ = *(ulong *)((long)pvVar57 + uVar46 * 4);
                          auVar60 = vpcmpgtb_avx((undefined1  [16])0x0,auVar66);
                          auVar60 = vpunpcklbw_avx(auVar66,auVar60);
                          auVar69 = vpmullw_avx(auVar63,auVar60);
                          auVar60 = vpmulhw_avx(auVar63,auVar60);
                          auVar60 = vpunpcklwd_avx(auVar69,auVar60);
                          auVar60 = vpaddd_avx(auVar62._0_16_,auVar60);
                          auVar62 = ZEXT1664(auVar60);
                          uVar46 = uVar46 + 1;
                        } while (uVar40 != uVar46);
                        pvVar57 = (void *)((long)pvVar57 + (ulong)uVar40 * 4);
                      }
                      auVar60 = auVar62._0_16_;
                      uVar38 = uVar38 + 1;
                    } while (uVar38 != uVar28);
                  }
                  *(undefined1 (*) [16])((long)pvVar50 + lVar45 * 0x10) = auVar60;
                  lVar45 = lVar45 + 1;
                } while (lVar45 != lVar43);
              }
              pvVar50 = (void *)((long)pvVar50 + lVar43 * 0x10);
              local_228 = (void *)((long)local_228 + 1);
            } while (local_228 != local_200);
          }
          _w = (void *)((long)_w + 1);
        } while ((Mat *)_w != local_1d0);
      }
      if (opt_q._0_8_ != 0) {
        operator_delete((void *)opt_q._0_8_,(long)opt_q.workspace_allocator - opt_q._0_8_);
      }
      opt_q.lightmode = false;
      opt_q._1_3_ = 0;
      opt_q.num_threads = 0;
      opt_q.blob_allocator._0_4_ = 0;
      opt_q.blob_allocator._4_4_ = 0;
      opt_q.workspace_allocator = (Allocator *)0x0;
      opt_q.openmp_blocktime = 0;
      opt_q._32_12_ = SUB1612((undefined1  [16])0x0,0);
      opt_q._32_28_ = ZEXT1228((undefined1  [12])opt_q._32_12_);
      Mat::create((Mat *)&opt_q,
                  *(int *)(this->_vptr_Convolution_x86_avx2[-3] + 0x30 +
                          (long)&(this->weight_data_3x3_winograd63).data),4,(Allocator *)0x0);
      pOVar25 = local_1d8;
      pMVar24 = local_1e8;
      pp_Var6 = this->_vptr_Convolution_x86_avx2;
      p_Var7 = pp_Var6[-3];
      p_Var27 = (_func_int *)((long)&this->_vptr_Convolution_x86_avx2 + (long)p_Var7);
      if (0 < *(int *)(p_Var7 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data)) {
        lVar43 = 0;
        do {
          fVar1 = *(float *)(*(long *)(p_Var27 + 0x1f0) + lVar43 * 4);
          fVar59 = 0.0;
          if (fVar1 != 0.0) {
            fVar59 = 1.0 / (fVar1 * **(float **)(p_Var27 + 0x238));
          }
          *(float *)(opt_q._0_8_ + lVar43 * 4) = fVar59;
          lVar43 = lVar43 + 1;
          p_Var7 = pp_Var6[-3];
          p_Var27 = (_func_int *)((long)&this->_vptr_Convolution_x86_avx2 + (long)p_Var7);
        } while (lVar43 < *(int *)(p_Var7 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data));
      }
      if (local_1ec < 0x65) {
        dequantize_from_int32
                  (&top_blob_int32,local_1e8,(Mat *)&opt_q,(Mat *)(p_Var27 + 0x1a8),local_1d8);
        pLVar9 = this->activation;
        if (pLVar9 != (Layer *)0x0) {
          (*pLVar9->_vptr_Layer[9])(pLVar9,pMVar24,pOVar25);
        }
      }
      else {
        requantize_from_int32_to_int8
                  (&top_blob_int32,local_1e8,(Mat *)&opt_q,(Mat *)(p_Var27 + 0x280),
                   (Mat *)(p_Var27 + 0x1a8),*(int *)(p_Var27 + 0x10c),(Mat *)(p_Var27 + 0x110),
                   local_1d8);
      }
      piVar5 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (opt_q._32_8_ == 0) {
            if (opt_q._0_8_ != 0) {
              free((void *)opt_q._0_8_);
            }
          }
          else {
            (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
          }
        }
      }
    }
    iVar30 = bottom_blob_bordered.c;
    iVar56 = bottom_blob_bordered.w;
    iVar55 = top_blob_int32.c;
    iVar39 = top_blob_int32.w;
    if ((iVar48 == 8) && (iVar4 == 1)) {
      p_Var27 = this->_vptr_Convolution_x86_avx2[-3];
      iVar26 = *(int *)(p_Var27 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data);
      iVar33 = *(int *)(p_Var27 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data);
      iVar36 = *(int *)(p_Var27 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data);
      iVar31 = *(int *)(p_Var27 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data);
      iVar34 = *(int *)(p_Var27 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data);
      local_1d0 = (Mat *)(long)*(int *)((long)&this->convolution_dilation1 + (long)p_Var27);
      uVar28 = (ulong)(uint)bottom_blob_bordered.c;
      lVar43 = (long)top_blob_int32.w;
      local_1e0 = (void *)(ulong)(uint)top_blob_int32.h;
      pvVar50 = (void *)(ulong)(uint)top_blob_int32.c;
      uVar40 = iVar26 * iVar33;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&opt_q,(long)(int)uVar40,
                 (allocator_type *)&local_20c);
      if (0 < iVar33) {
        iVar42 = 0;
        iVar32 = 0;
        iVar35 = 0;
        do {
          if (0 < iVar26) {
            lVar45 = 0;
            do {
              *(int *)(opt_q._0_8_ + (long)iVar42 * 4 + lVar45 * 4) = iVar32;
              iVar32 = iVar32 + iVar36;
              lVar45 = lVar45 + 1;
            } while (iVar26 != (int)lVar45);
            iVar42 = iVar42 + (int)lVar45;
          }
          iVar32 = iVar32 + (iVar56 * iVar31 - iVar36 * iVar26);
          iVar35 = iVar35 + 1;
        } while (iVar35 != iVar33);
      }
      if (0 < iVar55) {
        local_208 = (void *)0x0;
        do {
          if (0 < (int)local_1e0) {
            local_230 = (void *)(top_blob_int32.elemsize * top_blob_int32.cstep * (long)local_208 +
                                (long)top_blob_int32.data);
            local_200 = (void *)0x0;
            do {
              if (0 < iVar39) {
                sVar51 = (this->weight_data_int8).cstep;
                local_1f8 = (long)local_200 * (long)local_1d0;
                sVar8 = (this->weight_data_int8).elemsize;
                pvVar57 = (this->weight_data_int8).data;
                lVar45 = 0;
                do {
                  if (iVar30 < 1) {
                    iVar55 = 0;
                  }
                  else {
                    uVar38 = 0;
                    iVar55 = 0;
                    pvVar54 = (void *)(sVar51 * sVar8 * (long)local_208 + (long)pvVar57);
                    do {
                      if (0 < (int)uVar40) {
                        uVar46 = 0;
                        do {
                          auVar61._8_8_ = 0;
                          auVar61._0_8_ =
                               *(ulong *)((long)bottom_blob_bordered.data +
                                         (long)*(int *)(opt_q._0_8_ + uVar46 * 4) * 8 +
                                         bottom_blob_bordered.elemsize * bottom_blob_bordered.cstep
                                         * uVar38 +
                                         (long)(iVar34 * 8 * (int)lVar45) +
                                         local_1f8 * bottom_blob_bordered.elemsize *
                                         (long)bottom_blob_bordered.w);
                          auVar60 = vpcmpgtb_avx((undefined1  [16])0x0,auVar61);
                          auVar63 = vpunpcklbw_avx(auVar61,auVar60);
                          auVar64._8_8_ = 0;
                          auVar64._0_8_ = *(ulong *)((long)pvVar54 + uVar46 * 8);
                          auVar60 = vpcmpgtb_avx((undefined1  [16])0x0,auVar64);
                          auVar60 = vpunpcklbw_avx(auVar64,auVar60);
                          auVar69 = vpmullw_avx(auVar60,auVar63);
                          auVar60 = vpmulhw_avx(auVar63,auVar60);
                          auVar63 = vpunpcklwd_avx(auVar69,auVar60);
                          auVar60 = vpunpckhwd_avx(auVar69,auVar60);
                          auVar60 = vpaddd_avx(auVar63,auVar60);
                          auVar60 = vphaddd_avx(auVar60,auVar60);
                          auVar60 = vphaddd_avx(auVar60,auVar60);
                          iVar55 = iVar55 + auVar60._0_4_;
                          uVar46 = uVar46 + 1;
                        } while (uVar40 != uVar46);
                        pvVar54 = (void *)((long)pvVar54 + (ulong)uVar40 * 8);
                      }
                      uVar38 = uVar38 + 1;
                    } while (uVar38 != uVar28);
                  }
                  *(int *)((long)local_230 + lVar45 * 4) = iVar55;
                  lVar45 = lVar45 + 1;
                } while (lVar45 != lVar43);
              }
              local_230 = (void *)((long)local_230 + lVar43 * 4);
              local_200 = (void *)((long)local_200 + 1);
            } while (local_200 != local_1e0);
          }
          local_208 = (void *)((long)local_208 + 1);
        } while (local_208 != pvVar50);
      }
      if (opt_q._0_8_ != 0) {
        operator_delete((void *)opt_q._0_8_,(long)opt_q.workspace_allocator - opt_q._0_8_);
      }
      opt_q.lightmode = false;
      opt_q._1_3_ = 0;
      opt_q.num_threads = 0;
      opt_q.blob_allocator._0_4_ = 0;
      opt_q.blob_allocator._4_4_ = 0;
      opt_q.workspace_allocator = (Allocator *)0x0;
      opt_q.openmp_blocktime = 0;
      opt_q._32_12_ = SUB1612((undefined1  [16])0x0,0);
      opt_q._32_28_ = ZEXT1228((undefined1  [12])opt_q._32_12_);
      Mat::create((Mat *)&opt_q,
                  *(int *)(this->_vptr_Convolution_x86_avx2[-3] + 0x30 +
                          (long)&(this->weight_data_3x3_winograd63).data),4,(Allocator *)0x0);
      pOVar25 = local_1d8;
      pMVar24 = local_1e8;
      pp_Var6 = this->_vptr_Convolution_x86_avx2;
      p_Var7 = pp_Var6[-3];
      p_Var27 = (_func_int *)((long)&this->_vptr_Convolution_x86_avx2 + (long)p_Var7);
      if (0 < *(int *)(p_Var7 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data)) {
        lVar43 = 0;
        do {
          fVar1 = *(float *)(*(long *)(p_Var27 + 0x1f0) + lVar43 * 4);
          fVar59 = 0.0;
          if (fVar1 != 0.0) {
            fVar59 = 1.0 / (fVar1 * **(float **)(p_Var27 + 0x238));
          }
          *(float *)(opt_q._0_8_ + lVar43 * 4) = fVar59;
          lVar43 = lVar43 + 1;
          p_Var7 = pp_Var6[-3];
          p_Var27 = (_func_int *)((long)&this->_vptr_Convolution_x86_avx2 + (long)p_Var7);
        } while (lVar43 < *(int *)(p_Var7 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data));
      }
      if (local_1ec < 0x65) {
        dequantize_from_int32
                  (&top_blob_int32,local_1e8,(Mat *)&opt_q,(Mat *)(p_Var27 + 0x1a8),local_1d8);
        pLVar9 = this->activation;
        if (pLVar9 != (Layer *)0x0) {
          (*pLVar9->_vptr_Layer[9])(pLVar9,pMVar24,pOVar25);
        }
      }
      else {
        requantize_from_int32_to_int8
                  (&top_blob_int32,local_1e8,(Mat *)&opt_q,(Mat *)(p_Var27 + 0x280),
                   (Mat *)(p_Var27 + 0x1a8),*(int *)(p_Var27 + 0x10c),(Mat *)(p_Var27 + 0x110),
                   local_1d8);
      }
      piVar5 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (opt_q._32_8_ == 0) {
            if (opt_q._0_8_ != 0) {
              free((void *)opt_q._0_8_);
            }
          }
          else {
            (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
          }
        }
      }
    }
    iVar30 = bottom_blob_bordered.c;
    iVar56 = top_blob_int32.c;
    iVar55 = top_blob_int32.w;
    pOVar25 = local_1d8;
    iVar39 = 0;
    opt_q.blob_allocator =
         (Allocator *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
    if ((iVar48 == 1) &&
       (opt_q.blob_allocator =
             (Allocator *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_),
       iVar4 == 1)) {
      if (((local_1d8->use_winograd_convolution == true) &&
          (((p_Var27 = this->_vptr_Convolution_x86_avx2[-3],
            *(int *)(p_Var27 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data) == 3 &&
            (*(int *)(p_Var27 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data) == 3)) &&
           (*(int *)(p_Var27 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data) == 1)))) &&
         ((((*(int *)(p_Var27 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data) == 1 &&
            (*(int *)(p_Var27 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data) == 1)) &&
           (*(int *)((long)&this->convolution_dilation1 + (long)p_Var27) == 1)) &&
          ((0xf < iVar3 &&
           (0xf < *(int *)(p_Var27 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data))))))) {
        conv3x3s1_winograd23_int8_sse
                  (&bottom_blob_bordered,&top_blob_int32,&this->weight_data_3x3_winograd23_int8,
                   local_1d8);
        opt_q.lightmode = false;
        opt_q._1_3_ = 0;
        opt_q.num_threads = 0;
        opt_q.blob_allocator._0_4_ = 0;
        opt_q.blob_allocator._4_4_ = 0;
        opt_q.workspace_allocator = (Allocator *)0x0;
        opt_q.openmp_blocktime = 0;
        opt_q._32_28_ = ZEXT1228((undefined1  [12])0x0);
        Mat::create((Mat *)&opt_q,
                    *(int *)(this->_vptr_Convolution_x86_avx2[-3] + 0x30 +
                            (long)&(this->weight_data_3x3_winograd63).data),4,(Allocator *)0x0);
        pp_Var6 = this->_vptr_Convolution_x86_avx2;
        p_Var7 = pp_Var6[-3];
        p_Var27 = (_func_int *)((long)&this->_vptr_Convolution_x86_avx2 + (long)p_Var7);
        if (0 < *(int *)(p_Var7 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data)) {
          lVar43 = 0;
          do {
            fVar1 = *(float *)(*(long *)(p_Var27 + 0x1f0) + lVar43 * 4);
            fVar59 = 0.0;
            if (fVar1 != 0.0) {
              fVar59 = 1.0 / (fVar1 * **(float **)(p_Var27 + 0x238));
            }
            *(float *)(opt_q._0_8_ + lVar43 * 4) = fVar59;
            lVar43 = lVar43 + 1;
            p_Var7 = pp_Var6[-3];
            p_Var27 = (_func_int *)((long)&this->_vptr_Convolution_x86_avx2 + (long)p_Var7);
          } while (lVar43 < *(int *)(p_Var7 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data)
                  );
        }
        if (local_1ec < 0x65) {
          dequantize_from_int32
                    (&top_blob_int32,local_1e8,(Mat *)&opt_q,(Mat *)(p_Var27 + 0x1a8),local_1d8);
          pLVar9 = this->activation;
          if (pLVar9 != (Layer *)0x0) {
            (*pLVar9->_vptr_Layer[9])(pLVar9,local_1e8,local_1d8);
          }
        }
        else {
          requantize_from_int32_to_int8
                    (&top_blob_int32,local_1e8,(Mat *)&opt_q,(Mat *)(p_Var27 + 0x280),
                     (Mat *)(p_Var27 + 0x1a8),*(int *)(p_Var27 + 0x10c),(Mat *)(p_Var27 + 0x110),
                     local_1d8);
        }
        Mat::~Mat((Mat *)&opt_q);
      }
      else {
        if ((local_1d8->use_sgemm_convolution == true) &&
           (((p_Var27 = this->_vptr_Convolution_x86_avx2[-3],
             *(int *)(p_Var27 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data) == 1 &&
             (*(int *)(p_Var27 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data) == 1)) &&
            (*(uint *)(p_Var27 + 0x1c + (long)&(this->weight_data_int8).data) < 2)))) {
          if (local_1ec < 0x65) {
            opt_q.lightmode = false;
            opt_q._1_3_ = 0;
            opt_q.num_threads = 0;
            opt_q.blob_allocator = (Allocator *)0x0;
            opt_q.workspace_allocator = (Allocator *)0x0;
            p_Var27 = (_func_int *)
                      ((long)&this->_vptr_Convolution_x86_avx2 +
                      (long)this->_vptr_Convolution_x86_avx2[-3]);
            if (0 < *(int *)(this->_vptr_Convolution_x86_avx2[-3] + 0x30 +
                            (long)&(this->weight_data_3x3_winograd63).data)) {
              lVar43 = 0;
              opt_q.blob_allocator = (Allocator *)(float *)0x0;
              do {
                fVar1 = *(float *)(*(long *)(p_Var27 + 0x1f0) + lVar43 * 4);
                local_20c = 0.0;
                if (fVar1 != 0.0) {
                  local_20c = 1.0 / (fVar1 * **(float **)(p_Var27 + 0x238));
                }
                if (opt_q.blob_allocator == opt_q.workspace_allocator) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)&opt_q,
                             (iterator)opt_q.blob_allocator,&local_20c);
                }
                else {
                  *(float *)opt_q.blob_allocator = local_20c;
                  opt_q.blob_allocator = (Allocator *)((long)opt_q.blob_allocator + 4);
                }
                lVar43 = lVar43 + 1;
                p_Var27 = (_func_int *)
                          ((long)&this->_vptr_Convolution_x86_avx2 +
                          (long)this->_vptr_Convolution_x86_avx2[-3]);
              } while (lVar43 < *(int *)(this->_vptr_Convolution_x86_avx2[-3] + 0x30 +
                                        (long)&(this->weight_data_3x3_winograd63).data));
            }
            iVar48 = *(int *)(p_Var27 + 0xd4);
            iVar3 = *(int *)(p_Var27 + 0xd8);
            iVar39 = *(int *)(p_Var27 + 0xe4);
            iVar55 = *(int *)(p_Var27 + 0xe8);
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_a8,(vector<float,_std::allocator<float>_> *)&opt_q);
            conv_im2col_sgemm_int8_dequant_sse
                      (&bottom_blob_bordered,local_1e8,(Mat *)(p_Var27 + 0x160),iVar48,iVar3,iVar39,
                       iVar55,(Mat *)(p_Var27 + 0x1a8),&local_a8,pOVar25);
          }
          else {
            opt_q.lightmode = false;
            opt_q._1_3_ = 0;
            opt_q.num_threads = 0;
            opt_q.blob_allocator = (Allocator *)0x0;
            opt_q.workspace_allocator = (Allocator *)0x0;
            p_Var27 = (_func_int *)
                      ((long)&this->_vptr_Convolution_x86_avx2 +
                      (long)this->_vptr_Convolution_x86_avx2[-3]);
            if (0 < *(int *)(this->_vptr_Convolution_x86_avx2[-3] + 0x30 +
                            (long)&(this->weight_data_3x3_winograd63).data)) {
              lVar43 = 0;
              opt_q.blob_allocator = (Allocator *)(float *)0x0;
              do {
                fVar1 = *(float *)(*(long *)(p_Var27 + 0x1f0) + lVar43 * 4);
                local_20c = 0.0;
                if (fVar1 != 0.0) {
                  local_20c = 1.0 / (fVar1 * **(float **)(p_Var27 + 0x238));
                }
                scale_out = **(float **)(p_Var27 + 0x280);
                if (opt_q.blob_allocator == opt_q.workspace_allocator) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)&opt_q,
                             (iterator)opt_q.blob_allocator,&local_20c);
                }
                else {
                  *(float *)opt_q.blob_allocator = local_20c;
                  opt_q.blob_allocator = (Allocator *)((long)opt_q.blob_allocator + 4);
                }
                if (opt_q.blob_allocator == opt_q.workspace_allocator) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)&opt_q,
                             (iterator)opt_q.blob_allocator,&scale_out);
                }
                else {
                  *(float *)opt_q.blob_allocator = scale_out;
                  opt_q.blob_allocator = (Allocator *)((long)opt_q.blob_allocator + 4);
                }
                lVar43 = lVar43 + 1;
                p_Var27 = (_func_int *)
                          ((long)&this->_vptr_Convolution_x86_avx2 +
                          (long)this->_vptr_Convolution_x86_avx2[-3]);
              } while (lVar43 < *(int *)(this->_vptr_Convolution_x86_avx2[-3] + 0x30 +
                                        (long)&(this->weight_data_3x3_winograd63).data));
            }
            iVar48 = *(int *)(p_Var27 + 0xd4);
            iVar3 = *(int *)(p_Var27 + 0xd8);
            iVar39 = *(int *)(p_Var27 + 0xe4);
            iVar55 = *(int *)(p_Var27 + 0xe8);
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_90,(vector<float,_std::allocator<float>_> *)&opt_q);
            conv_im2col_sgemm_int8_requant_sse
                      (&bottom_blob_bordered,local_1e8,(Mat *)(p_Var27 + 0x160),iVar48,iVar3,iVar39,
                       iVar55,(Mat *)(p_Var27 + 0x1a8),&local_90,pOVar25);
            local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
          }
          if (local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                  .super__Vector_impl_data._M_end_of_storage -
                            (long)local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                  .super__Vector_impl_data._M_start);
          }
          pMVar24 = local_1e8;
          if (opt_q._0_8_ != 0) {
            operator_delete((void *)opt_q._0_8_,(long)opt_q.workspace_allocator - opt_q._0_8_);
          }
          pLVar9 = this->activation;
          iVar39 = 0;
          if (pLVar9 != (Layer *)0x0) {
            (*pLVar9->_vptr_Layer[9])(pLVar9,pMVar24,pOVar25);
          }
          goto LAB_00186906;
        }
        p_Var27 = this->_vptr_Convolution_x86_avx2[-3];
        iVar48 = *(int *)(p_Var27 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data);
        iVar3 = *(int *)(p_Var27 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data);
        iVar39 = *(int *)(p_Var27 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data);
        iVar4 = *(int *)(p_Var27 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data);
        local_200 = (void *)(long)*(int *)(p_Var27 + 0x44 +
                                          (long)&(this->weight_data_3x3_winograd63).data);
        local_1d0 = (Mat *)(long)*(int *)((long)&this->convolution_dilation1 + (long)p_Var27);
        local_1f8 = CONCAT44(local_1f8._4_4_,bottom_blob_bordered.w);
        uVar38 = (ulong)(uint)bottom_blob_bordered.c;
        lVar43 = (long)top_blob_int32.w;
        local_208 = (void *)(ulong)(uint)top_blob_int32.h;
        uVar28 = (ulong)(uint)top_blob_int32.c;
        uVar40 = iVar48 * iVar3;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&opt_q,(long)(int)uVar40,
                   (allocator_type *)&local_20c);
        if (0 < iVar3) {
          iVar26 = 0;
          iVar33 = 0;
          iVar36 = 0;
          do {
            if (0 < iVar48) {
              lVar45 = 0;
              do {
                *(int *)(opt_q._0_8_ + (long)iVar26 * 4 + lVar45 * 4) = iVar36;
                iVar36 = iVar36 + iVar39;
                lVar45 = lVar45 + 1;
              } while (iVar48 != (int)lVar45);
              iVar26 = iVar26 + (int)lVar45;
            }
            iVar36 = iVar36 + ((int)local_1f8 * iVar4 - iVar39 * iVar48);
            iVar33 = iVar33 + 1;
          } while (iVar33 != iVar3);
        }
        if (0 < iVar56) {
          local_218 = 0;
          do {
            if (0 < (int)local_208) {
              local_230 = (void *)(top_blob_int32.elemsize * top_blob_int32.cstep * local_218 +
                                  (long)top_blob_int32.data);
              lVar45 = *(long *)(p_Var27 + 0x28 +
                                (long)&(this->weight_data_3x3_winograd23_int8).data);
              local_1e0 = (void *)0x0;
              do {
                if (0 < iVar55) {
                  local_1f8 = (long)local_1e0 * (long)local_1d0;
                  lVar29 = 0;
                  do {
                    if (iVar30 < 1) {
                      iVar48 = 0;
                    }
                    else {
                      uVar46 = 0;
                      iVar48 = 0;
                      lVar52 = (int)(iVar30 * uVar40 * (int)local_218) + lVar45;
                      do {
                        if (0 < (int)uVar40) {
                          uVar37 = 0;
                          do {
                            iVar48 = iVar48 + (int)*(char *)(lVar52 + uVar37) *
                                              (int)*(char *)((long)bottom_blob_bordered.data +
                                                            (long)*(int *)(opt_q._0_8_ + uVar37 * 4)
                                                            + bottom_blob_bordered.elemsize *
                                                              bottom_blob_bordered.cstep * uVar46 +
                                                              lVar29 * (long)local_200 +
                                                              local_1f8 *
                                                              bottom_blob_bordered.elemsize *
                                                              (long)bottom_blob_bordered.w);
                            uVar37 = uVar37 + 1;
                          } while (uVar40 != uVar37);
                        }
                        lVar52 = lVar52 + (int)uVar40;
                        uVar46 = uVar46 + 1;
                      } while (uVar46 != uVar38);
                    }
                    *(int *)((long)local_230 + lVar29 * 4) = iVar48;
                    lVar29 = lVar29 + 1;
                  } while (lVar29 != lVar43);
                }
                local_230 = (void *)((long)local_230 + lVar43 * 4);
                local_1e0 = (void *)((long)local_1e0 + 1);
              } while (local_1e0 != local_208);
            }
            local_218 = local_218 + 1;
          } while (local_218 != uVar28);
        }
        if (opt_q._0_8_ != 0) {
          operator_delete((void *)opt_q._0_8_,(long)opt_q.workspace_allocator - opt_q._0_8_);
        }
        opt_q.lightmode = false;
        opt_q._1_3_ = 0;
        opt_q.num_threads = 0;
        opt_q.blob_allocator._0_4_ = 0;
        opt_q.blob_allocator._4_4_ = 0;
        opt_q.workspace_allocator = (Allocator *)0x0;
        opt_q.openmp_blocktime = 0;
        opt_q._32_12_ = SUB1612((undefined1  [16])0x0,0);
        opt_q._32_28_ = ZEXT1228((undefined1  [12])opt_q._32_12_);
        Mat::create((Mat *)&opt_q,
                    *(int *)(this->_vptr_Convolution_x86_avx2[-3] + 0x30 +
                            (long)&(this->weight_data_3x3_winograd63).data),4,(Allocator *)0x0);
        pOVar25 = local_1d8;
        pMVar24 = local_1e8;
        pp_Var6 = this->_vptr_Convolution_x86_avx2;
        p_Var7 = pp_Var6[-3];
        p_Var27 = (_func_int *)((long)&this->_vptr_Convolution_x86_avx2 + (long)p_Var7);
        if (0 < *(int *)(p_Var7 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data)) {
          lVar43 = 0;
          do {
            fVar1 = *(float *)(*(long *)(p_Var27 + 0x1f0) + lVar43 * 4);
            fVar59 = 0.0;
            if (fVar1 != 0.0) {
              fVar59 = 1.0 / (fVar1 * **(float **)(p_Var27 + 0x238));
            }
            *(float *)(opt_q._0_8_ + lVar43 * 4) = fVar59;
            lVar43 = lVar43 + 1;
            p_Var7 = pp_Var6[-3];
            p_Var27 = (_func_int *)((long)&this->_vptr_Convolution_x86_avx2 + (long)p_Var7);
          } while (lVar43 < *(int *)(p_Var7 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data)
                  );
        }
        if (local_1ec < 0x65) {
          dequantize_from_int32
                    (&top_blob_int32,local_1e8,(Mat *)&opt_q,(Mat *)(p_Var27 + 0x1a8),local_1d8);
          pLVar9 = this->activation;
          if (pLVar9 != (Layer *)0x0) {
            (*pLVar9->_vptr_Layer[9])(pLVar9,pMVar24,pOVar25);
          }
        }
        else {
          requantize_from_int32_to_int8
                    (&top_blob_int32,local_1e8,(Mat *)&opt_q,(Mat *)(p_Var27 + 0x280),
                     (Mat *)(p_Var27 + 0x1a8),*(int *)(p_Var27 + 0x10c),(Mat *)(p_Var27 + 0x110),
                     local_1d8);
        }
        piVar5 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (opt_q._32_8_ == 0) {
              if (opt_q._0_8_ != 0) {
                free((void *)opt_q._0_8_);
              }
            }
            else {
              (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
            }
          }
        }
      }
      iVar39 = 0;
    }
  }
LAB_00186906:
  piVar5 = (int *)CONCAT44(top_blob_int32.refcount._4_4_,top_blob_int32.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (top_blob_int32.allocator == (Allocator *)0x0) {
        if (top_blob_int32.data != (void *)0x0) {
          free(top_blob_int32.data);
        }
      }
      else {
        (*(top_blob_int32.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_00186942:
  piVar5 = (int *)CONCAT44(bottom_blob_bordered.refcount._4_4_,bottom_blob_bordered.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (bottom_blob_bordered.allocator == (Allocator *)0x0) {
        if (bottom_blob_bordered.data != (void *)0x0) {
          free(bottom_blob_bordered.data);
        }
      }
      else {
        (*(bottom_blob_bordered.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar5 = (int *)CONCAT44(local_78._12_4_,local_78._8_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if ((Allocator *)local_78._32_8_ == (Allocator *)0x0) {
        if ((void *)local_78._0_8_ != (void *)0x0) {
          free((void *)local_78._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_78._32_8_)[3])();
      }
    }
  }
  return iVar39;
}

Assistant:

int Convolution_x86_avx2::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elembits = bottom_blob.elembits();

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, bottom_blob_int8_scales, opt_q);
    }

    //     NCNN_LOGE("Convolution_arm input %d x %d  ksize=%d %d  stride=%d %d", w, h, kernel_w, kernel_h, stride_w, stride_h);

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    int w = bottom_blob_bordered.w;
    int h = bottom_blob_bordered.h;
    int channels = bottom_blob_bordered.c;
    int elempack = bottom_blob_bordered.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__
    bool use_int8_requantize = int8_scale_term > 100;
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    //     NCNN_LOGE("forward_int8_arm %d %d %d    %d %d", w, h, bottom_blob_bordered.c, elempack, out_elempack);

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const int num_input = channels * elempack;

    Mat top_blob_int32;
    top_blob_int32.create(outw, outh, num_output / out_elempack, (size_t)(4u * out_elempack), out_elempack, opt.workspace_allocator);
    if (top_blob_int32.empty())
        return -100;

#if __SSE2__
    if (elempack == 8 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv1x1s1_sgemm_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_int8, opt);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv1x1s2_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_int8, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_int8, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
        else
        {
            convolution_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_int8, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }

        Mat scale_in_data(num_output);
        for (int p = 0; p < num_output; p++)
        {
            // requantize and relu
            float scale_in;
            if (weight_data_int8_scales[p] == 0)
                scale_in = 0;
            else
                scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

            scale_in_data[p] = scale_in;
        }

        if (use_int8_requantize)
        {
            requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
        }
        else
        {
            dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
        }
    }

    if (elempack == 1 && out_elempack == 4)
    {
        convolution_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_int8, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);

        Mat scale_in_data(num_output);
        for (int p = 0; p < num_output; p++)
        {
            // requantize and relu
            float scale_in;
            if (weight_data_int8_scales[p] == 0)
                scale_in = 0;
            else
                scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

            scale_in_data[p] = scale_in;
        }

        if (use_int8_requantize)
        {
            requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
        }
        else
        {
            dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        convolution_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_int8, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);

        Mat scale_in_data(num_output);
        for (int p = 0; p < num_output; p++)
        {
            // requantize and relu
            float scale_in;
            if (weight_data_int8_scales[p] == 0)
                scale_in = 0;
            else
                scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

            scale_in_data[p] = scale_in;
        }

        if (use_int8_requantize)
        {
            requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
        }
        else
        {
            dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack == 1)
    {
        if (opt.use_winograd_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && num_input >= 16 && num_output >= 16)
        {
            conv3x3s1_winograd23_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_3x3_winograd23_int8, opt);
            //             conv3x3s1_winograd43_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_3x3_winograd23_int8, opt);

            Mat scale_in_data(num_output);
            for (int p = 0; p < num_output; p++)
            {
                // requantize and relu
                float scale_in;
                if (weight_data_int8_scales[p] == 0)
                    scale_in = 0;
                else
                    scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

                scale_in_data[p] = scale_in;
            }

            if (use_int8_requantize)
            {
                requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
            }
            else
            {
                dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
        }
        else if (opt.use_sgemm_convolution && dilation_w == 1 && dilation_h == 1 && (activation_type == 0 || activation_type == 1))
        {
            if (use_int8_requantize)
            {
                std::vector<float> requantize_scales;
                for (int p = 0; p < num_output; p++)
                {
                    float scale_in;
                    if (weight_data_int8_scales[p] == 0)
                        scale_in = 0;
                    else
                        scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

                    float scale_out = top_blob_int8_scales[0];

                    requantize_scales.push_back(scale_in);
                    requantize_scales.push_back(scale_out);
                }

                conv_im2col_sgemm_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data, kernel_w, kernel_h, stride_w, stride_h, bias_data, requantize_scales, opt);
            }
            else
            {
                std::vector<float> dequantize_scales;
                for (int p = 0; p < num_output; p++)
                {
                    float scale_in;
                    if (weight_data_int8_scales[p] == 0)
                        scale_in = 0;
                    else
                        scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

                    dequantize_scales.push_back(scale_in);
                }

                conv_im2col_sgemm_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data, kernel_w, kernel_h, stride_w, stride_h, bias_data, dequantize_scales, opt);
            }

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
        }
        else
        {
            //         convolution_int8(bottom_blob_bordered, top_blob_int32, weight_data_int8, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
            convolution_int8(bottom_blob_bordered, top_blob_int32, weight_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);

            Mat scale_in_data(num_output);
            for (int p = 0; p < num_output; p++)
            {
                // requantize and relu
                float scale_in;
                if (weight_data_int8_scales[p] == 0)
                    scale_in = 0;
                else
                    scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

                scale_in_data[p] = scale_in;
            }

            if (use_int8_requantize)
            {
                requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
            }
            else
            {
                dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
        }
    }

    return 0;
}